

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtered_re2_test.cc
# Opt level: O2

void re2::FilteredRE2TestMatchEmptyPattern(void)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  string text;
  vector<int,_std::allocator<int>_> matching_regexps;
  vector<int,_std::allocator<int>_> atom_ids;
  FilterTestVars v;
  LogMessageFatal local_190;
  
  FLAGS_filtered_re2_min_atom_len = 3;
  FilterTestVars::FilterTestVars(&v);
  std::__cxx11::string::string((string *)&local_190,atom_tests,(allocator *)&text);
  bVar1 = std::operator==("CheckEmptyPattern",
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_190);
  std::__cxx11::string::~string((string *)&local_190);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/filtered_re2_test.cc"
               ,0xd6);
    std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                    "Check failed: (\"CheckEmptyPattern\") == (string(t->testname))");
    LogMessageFatal::~LogMessageFatal(&local_190);
  }
  lVar3 = 0;
  iVar2 = 0x14;
  do {
    if (lVar3 == 0x14) {
LAB_001231d6:
      AddRegexpsAndCompile((char **)&DAT_001602e8,iVar2,&v);
      std::__cxx11::string::string((string *)&text,"0123",(allocator *)&local_190);
      atom_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      matching_regexps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      atom_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      atom_ids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      matching_regexps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      matching_regexps.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_190.super_LogMessage._0_8_ = text._M_dataplus._M_p;
      local_190.super_LogMessage._8_4_ = (int)text._M_string_length;
      iVar2 = FilteredRE2::FirstMatch(&v.f,(StringPiece *)&local_190,&atom_ids);
      if (iVar2 != 0) {
        LogMessageFatal::LogMessageFatal
                  (&local_190,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/filtered_re2_test.cc"
                   ,0xdf);
        std::operator<<((ostream *)&local_190.super_LogMessage.str_,
                        "Check failed: (0) == (v.f.FirstMatch(text, atom_ids))");
        LogMessageFatal::~LogMessageFatal(&local_190);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&matching_regexps.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&atom_ids.super__Vector_base<int,_std::allocator<int>_>);
      std::__cxx11::string::~string((string *)&text);
      FilterTestVars::~FilterTestVars(&v);
      return;
    }
    if ((&DAT_001602e8)[lVar3] == 0) {
      iVar2 = (int)lVar3;
      goto LAB_001231d6;
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

TEST(FilteredRE2Test, MatchEmptyPattern) {
  FLAGS_filtered_re2_min_atom_len = 3;

  FilterTestVars v;
  AtomTest* t = &atom_tests[0];
  // We are using the regexps used in one of the atom tests
  // for this test. Adding the EXPECT here to make sure
  // the index we use for the test is for the correct test.
  EXPECT_EQ("CheckEmptyPattern", string(t->testname));
  int nregexp;
  for (nregexp = 0; nregexp < arraysize(t->regexps); nregexp++)
    if (t->regexps[nregexp] == NULL)
      break;
  AddRegexpsAndCompile(t->regexps, nregexp, &v);
  string text = "0123";
  vector<int> atom_ids;
  vector<int> matching_regexps;
  EXPECT_EQ(0, v.f.FirstMatch(text, atom_ids));
}